

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<8>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  int *piVar1;
  FragmentPacket *pFVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  Vector<long,_4> *pVVar22;
  int iVar23;
  Vector<long,_4> *pVVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  int fragNdx;
  int iVar33;
  long lVar34;
  long lVar35;
  Vector<long,_4> *pVVar36;
  long lVar37;
  float fVar38;
  float fVar39;
  Vec4 z0;
  Vec4 z1;
  Vec4 e20f;
  Vec4 e12f;
  Vec4 e01f;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  deInt64 sy [4];
  Vec4 edgeSum;
  long local_378 [2];
  int local_368;
  int iStack_364;
  int local_358;
  int iStack_354;
  long lStack_350;
  Vec4 bSum;
  Vector<long,_4> e20 [8];
  Vector<long,_4> e12 [8];
  Vector<long,_4> e01 [8];
  
  fVar3 = (this->m_v2).m_data[2];
  fVar38 = (this->m_v0).m_data[2] - fVar3;
  fVar39 = (this->m_v1).m_data[2] - fVar3;
  iVar14 = 0;
  while( true ) {
    iVar4 = (this->m_curPos).m_data[1];
    if (((this->m_bboxMax).m_data[1] < iVar4) || (maxFragmentPackets <= iVar14)) break;
    iVar5 = (this->m_curPos).m_data[0];
    sy[0] = (deInt64)(iVar4 << 8);
    iVar23 = iVar4 + 1;
    sy[2] = (deInt64)(iVar23 * 0x100);
    iVar33 = iVar5 + 1;
    local_358 = iVar33 * 0x100;
    iStack_354 = -(uint)(local_358 < 0);
    local_378[0] = CONCAT44(-(uint)(iVar5 << 8 < 0),iVar5 << 8);
    _local_368 = CONCAT44(iStack_354,local_358);
    iVar12 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
    iVar13 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
    lVar21 = 0;
    sy[1] = sy[0];
    sy[3] = sy[2];
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)e01[0].m_data + lVar21));
      lVar21 = lVar21 + 0x20;
    } while (lVar21 != 0x100);
    lVar21 = 0;
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)e12[0].m_data + lVar21));
      lVar21 = lVar21 + 0x20;
    } while (lVar21 != 0x100);
    lVar21 = 0;
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)e20[0].m_data + lVar21));
      lVar21 = lVar21 + 0x20;
    } while (lVar21 != 0x100);
    lVar21 = (this->m_edge01).a;
    lVar20 = (this->m_edge01).b;
    lVar28 = (this->m_edge01).c;
    lVar30 = (this->m_edge12).a;
    lVar6 = (this->m_edge12).b;
    lVar7 = (this->m_edge12).c;
    lVar8 = (this->m_edge20).a;
    lVar9 = (this->m_edge20).b;
    lVar10 = (this->m_edge20).c;
    pVVar36 = e01;
    pVVar24 = e12;
    pVVar22 = e20;
    for (lVar35 = 0; lVar35 != 8; lVar35 = lVar35 + 1) {
      lVar32 = (&s_samplePos8)[lVar35 * 2];
      lVar37 = (&DAT_01915a48)[lVar35 * 2];
      for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
        lVar15 = local_378[lVar34] + lVar32;
        lVar18 = sy[lVar34] + lVar37;
        pVVar36->m_data[lVar34] = lVar20 * lVar18 + lVar21 * lVar15 + lVar28;
        pVVar24->m_data[lVar34] = lVar6 * lVar18 + lVar30 * lVar15 + lVar7;
        pVVar22->m_data[lVar34] = lVar18 * lVar9 + lVar15 * lVar8 + lVar10;
      }
      pVVar22 = pVVar22 + 1;
      pVVar24 = pVVar24 + 1;
      pVVar36 = pVVar36 + 1;
    }
    uVar19 = (ulong)(this->m_edge01).inclusive;
    lVar20 = -uVar19;
    uVar27 = (ulong)(this->m_edge12).inclusive;
    lVar28 = -uVar27;
    uVar29 = (ulong)(this->m_edge20).inclusive;
    lVar30 = -uVar29;
    lVar21 = 0x18;
    uVar25 = 0;
    for (uVar17 = 0; uVar17 != 8; uVar17 = uVar17 + 1) {
      lVar6 = *(long *)((long)e12[7].m_data + lVar21 + 8);
      if ((lVar6 == lVar20 || SBORROW8(lVar6,lVar20) != (long)(lVar6 + uVar19) < 0) ||
         (lVar6 = *(long *)((long)e20[7].m_data + lVar21 + 8),
         lVar6 == lVar28 || SBORROW8(lVar6,lVar28) != (long)(lVar6 + uVar27) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)&lStack_350 + lVar21);
        bVar11 = lVar6 != lVar30 && SBORROW8(lVar6,lVar30) == (long)(lVar6 + uVar29) < 0;
      }
      uVar26 = uVar25 & ~(1L << (uVar17 & 0x3f));
      if (bVar11) {
        uVar26 = uVar25 | 1L << (uVar17 & 0x3f);
      }
      if (((iVar33 == iVar12) ||
          (lVar6 = *(long *)((long)e12[7].m_data + lVar21 + 0x10),
          lVar6 == lVar20 || SBORROW8(lVar6,lVar20) != (long)(lVar6 + uVar19) < 0)) ||
         (lVar6 = *(long *)((long)e20[7].m_data + lVar21 + 0x10),
         lVar6 == lVar28 || SBORROW8(lVar6,lVar28) != (long)(lVar6 + uVar27) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)bSum.m_data + lVar21);
        bVar11 = lVar6 != lVar30 && SBORROW8(lVar6,lVar30) == (long)(lVar6 + uVar29) < 0;
      }
      bVar16 = (byte)uVar17;
      uVar31 = 0x10000L << (bVar16 & 0x3f);
      uVar25 = ~uVar31 & uVar26;
      if (bVar11) {
        uVar25 = uVar26 | uVar31;
      }
      if (((iVar23 == iVar13) ||
          (lVar6 = *(long *)((long)e12[7].m_data + lVar21 + 0x18),
          lVar6 == lVar20 || SBORROW8(lVar6,lVar20) != (long)(lVar6 + uVar19) < 0)) ||
         (lVar6 = *(long *)((long)e20[7].m_data + lVar21 + 0x18),
         lVar6 == lVar28 || SBORROW8(lVar6,lVar28) != (long)(lVar6 + uVar27) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)bSum.m_data + lVar21 + 8);
        bVar11 = lVar6 != lVar30 && SBORROW8(lVar6,lVar30) == (long)(lVar6 + uVar29) < 0;
      }
      uVar31 = 0x100L << (bVar16 & 0x3f);
      uVar26 = ~uVar31 & uVar25;
      if (bVar11) {
        uVar26 = uVar25 | uVar31;
      }
      if (((iVar23 == iVar13 || iVar33 == iVar12) ||
          (lVar6 = *(long *)((long)e01[0].m_data + lVar21),
          lVar6 == lVar20 || SBORROW8(lVar6,lVar20) != (long)(lVar6 + uVar19) < 0)) ||
         (lVar6 = *(long *)((long)e12[0].m_data + lVar21),
         lVar6 == lVar28 || SBORROW8(lVar6,lVar28) != (long)(lVar6 + uVar27) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)e20[0].m_data + lVar21);
        bVar11 = lVar6 != lVar30 && SBORROW8(lVar6,lVar30) == (long)(lVar6 + uVar29) < 0;
      }
      uVar31 = 0x1000000L << (bVar16 & 0x3f);
      uVar25 = ~uVar31 & uVar26;
      if (bVar11) {
        uVar25 = uVar26 | uVar31;
      }
      lVar21 = lVar21 + 0x20;
    }
    iVar12 = (this->m_curPos).m_data[0] + 2;
    (this->m_curPos).m_data[0] = iVar12;
    if ((this->m_bboxMax).m_data[0] < iVar12) {
      piVar1 = (this->m_curPos).m_data + 1;
      *piVar1 = *piVar1 + 2;
      (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
    }
    if (uVar25 != 0) {
      if (depthValues != (float *)0x0) {
        lVar21 = (long)(iVar14 << 5) * 4;
        for (lVar20 = -0x20; lVar20 != 0; lVar20 = lVar20 + 4) {
          tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)&e01f);
          tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)&e12f);
          tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)&e20f);
          tcu::operator+((tcu *)&z0,&e01f,(Vector<float,_4> *)&e12f);
          tcu::operator+((tcu *)&edgeSum,(Vector<float,_4> *)&z0,&e20f);
          tcu::operator/((tcu *)&z0,&e12f,(Vector<float,_4> *)&edgeSum);
          tcu::operator/((tcu *)&z1,&e20f,(Vector<float,_4> *)&edgeSum);
          *(float *)((long)depthValues + lVar20 + lVar21 + 0x20) =
               z0.m_data[0] * fVar38 + z1.m_data[0] * fVar39 + fVar3;
          *(float *)((long)depthValues + lVar20 + lVar21 + 0x40) =
               z0.m_data[1] * fVar38 + z1.m_data[1] * fVar39 + fVar3;
          *(float *)((long)depthValues + lVar20 + lVar21 + 0x60) =
               z0.m_data[2] * fVar38 + z1.m_data[2] * fVar39 + fVar3;
          *(float *)((long)depthValues + lVar20 + lVar21 + 0x80) =
               z0.m_data[3] * fVar38 + z1.m_data[3] * fVar39 + fVar3;
        }
      }
      tcu::Vector<float,_4>::Vector(&e01f);
      tcu::Vector<float,_4>::Vector(&e12f);
      tcu::Vector<float,_4>::Vector(&e20f);
      lVar21 = (this->m_edge01).a;
      lVar20 = (this->m_edge01).b;
      lVar28 = (this->m_edge01).c;
      lVar30 = (this->m_edge12).a;
      lVar6 = (this->m_edge12).b;
      lVar7 = (this->m_edge12).c;
      lVar8 = (this->m_edge20).a;
      lVar9 = (this->m_edge20).b;
      lVar10 = (this->m_edge20).c;
      for (lVar35 = 0; lVar35 != 0x10; lVar35 = lVar35 + 4) {
        lVar37 = *(long *)((long)local_378 + lVar35 * 2) + 0x80;
        lVar32 = *(long *)((long)sy + lVar35 * 2) + 0x80;
        *(float *)((long)e01f.m_data + lVar35) = (float)(lVar20 * lVar32 + lVar21 * lVar37 + lVar28)
        ;
        *(float *)((long)e12f.m_data + lVar35) = (float)(lVar6 * lVar32 + lVar30 * lVar37 + lVar7);
        *(float *)((long)e20f.m_data + lVar35) = (float)(lVar32 * lVar9 + lVar37 * lVar8 + lVar10);
      }
      tcu::operator*((tcu *)&edgeSum,(this->m_v0).m_data[3],&e12f);
      tcu::operator*((tcu *)&z0,(this->m_v1).m_data[3],&e20f);
      tcu::operator*((tcu *)&z1,(this->m_v2).m_data[3],&e01f);
      tcu::operator+((tcu *)&local_3b8,(Vector<float,_4> *)&edgeSum,(Vector<float,_4> *)&z0);
      tcu::operator+((tcu *)&bSum,(Vector<float,_4> *)&local_3b8,(Vector<float,_4> *)&z1);
      pFVar2 = fragmentPackets + iVar14;
      *(ulong *)(pFVar2->position).m_data = CONCAT44(iVar4,iVar5);
      pFVar2->coverage = uVar25;
      tcu::operator/((tcu *)&local_3b8,&edgeSum,(Vector<float,_4> *)&bSum);
      *(undefined8 *)pFVar2->barycentric[0].m_data = local_3b8;
      *(undefined8 *)(pFVar2->barycentric[0].m_data + 2) = uStack_3b0;
      tcu::operator/((tcu *)&local_3b8,&z0,(Vector<float,_4> *)&bSum);
      *(undefined8 *)fragmentPackets[iVar14].barycentric[1].m_data = local_3b8;
      *(undefined8 *)(fragmentPackets[iVar14].barycentric[1].m_data + 2) = uStack_3b0;
      tcu::operator-((tcu *)&local_358,1.0,pFVar2->barycentric);
      tcu::operator-((tcu *)&local_3b8,(Vector<float,_4> *)&local_358,
                     fragmentPackets[iVar14].barycentric + 1);
      *(undefined8 *)fragmentPackets[iVar14].barycentric[2].m_data = local_3b8;
      *(undefined8 *)(fragmentPackets[iVar14].barycentric[2].m_data + 2) = uStack_3b0;
      iVar14 = iVar14 + 1;
    }
  }
  *numPacketsRasterized = iVar14;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}